

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O1

void __thiscall
argh::stringstream_proxy::stringstream_proxy(stringstream_proxy *this,stringstream_proxy *other)

{
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  std::__cxx11::stringbuf::str();
  std::__cxx11::istringstream::istringstream((istringstream *)this,(string *)local_38,_S_in);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  std::ios::clear((int)this + (int)*(undefined8 *)(*(long *)this + -0x18));
  return;
}

Assistant:

stringstream_proxy(const stringstream_proxy& other) :
         stream_(other.stream_.str())
      {
         stream_.setstate(other.stream_.rdstate());
      }